

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitruntime.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::JitRuntime::_add(JitRuntime *this,void **dst,CodeHolder *code)

{
  Error EVar1;
  size_t size;
  JitAllocator *this_00;
  size_t codeSize;
  CodeHolder *code_local;
  Span span;
  CodeHolder **local_38;
  undefined1 *local_30;
  
  *dst = (void *)0x0;
  code_local = code;
  EVar1 = CodeHolder::flatten(code);
  if ((EVar1 == 0) && (EVar1 = CodeHolder::resolveUnresolvedLinks(code), EVar1 == 0)) {
    size = CodeHolder::codeSize(code);
    if (size == 0) {
      EVar1 = 10;
    }
    else {
      span._size = 0;
      span._block = (void *)0x0;
      span._rx = (void *)0x0;
      span._rw = (void *)0x0;
      span._flags = kNone;
      span._reserved = 0;
      this_00 = &this->_allocator;
      EVar1 = JitAllocator::alloc(this_00,&span,size);
      if (EVar1 == 0) {
        EVar1 = CodeHolder::relocateToBase(code,(uint64_t)span._rx);
        if (EVar1 == 0) {
          codeSize = CodeHolder::codeSize(code);
          if (size < codeSize) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/jitruntime.cpp"
                       ,0x2e,"codeSize <= estimatedCodeSize");
          }
          local_38 = &code_local;
          EVar1 = 0;
          local_30 = (undefined1 *)&codeSize;
          JitAllocator::write(this_00,(int)&span,
                              JitAllocator::
                              write<asmjit::v1_14::JitRuntime::_add(void**,asmjit::v1_14::CodeHolder*)::$_0>(asmjit::v1_14::JitAllocator::Span&,asmjit::v1_14::JitRuntime::_add(void**,asmjit::v1_14::CodeHolder*)::$_0&&,asmjit::v1_14::VirtMem::CachePolicy)
                              ::{lambda(asmjit::v1_14::JitAllocator::Span&,void*)#1}::Span__void__,
                              (size_t)&local_38);
          *dst = span._rx;
        }
        else {
          JitAllocator::release(this_00,span._rx);
        }
      }
    }
  }
  return EVar1;
}

Assistant:

Error JitRuntime::_add(void** dst, CodeHolder* code) noexcept {
  *dst = nullptr;

  ASMJIT_PROPAGATE(code->flatten());
  ASMJIT_PROPAGATE(code->resolveUnresolvedLinks());

  size_t estimatedCodeSize = code->codeSize();
  if (ASMJIT_UNLIKELY(estimatedCodeSize == 0))
    return DebugUtils::errored(kErrorNoCodeGenerated);

  JitAllocator::Span span;
  ASMJIT_PROPAGATE(_allocator.alloc(span, estimatedCodeSize));

  // Relocate the code.
  Error err = code->relocateToBase(uintptr_t(span.rx()));
  if (ASMJIT_UNLIKELY(err)) {
    _allocator.release(span.rx());
    return err;
  }

  // Recalculate the final code size and shrink the memory we allocated for it
  // in case that some relocations didn't require records in an address table.
  size_t codeSize = code->codeSize();
  ASMJIT_ASSERT(codeSize <= estimatedCodeSize);

  _allocator.write(span, [&](JitAllocator::Span& span) noexcept -> Error {
    uint8_t* rw = static_cast<uint8_t*>(span.rw());

    for (Section* section : code->_sections) {
      size_t offset = size_t(section->offset());
      size_t bufferSize = size_t(section->bufferSize());
      size_t virtualSize = size_t(section->virtualSize());

      ASMJIT_ASSERT(offset + bufferSize <= span.size());
      memcpy(rw + offset, section->data(), bufferSize);

      if (virtualSize > bufferSize) {
        ASMJIT_ASSERT(offset + virtualSize <= span.size());
        memset(rw + offset + bufferSize, 0, virtualSize - bufferSize);
      }
    }

    span.shrink(codeSize);
    return kErrorOk;
  });

  *dst = span.rx();
  return kErrorOk;
}